

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

int wstran_dialer_setopt(void *arg,char *name,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  
  iVar1 = nni_stream_dialer_set(*(nng_stream_dialer **)((long)arg + 0x210),name,buf,sz,t);
  if (iVar1 == 9) {
    iVar1 = nni_setopt(wstran_ep_opts,name,arg,buf,sz,t);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int
wstran_dialer_setopt(
    void *arg, const char *name, const void *buf, size_t sz, nni_type t)
{
	ws_dialer *d = arg;
	int        rv;

	rv = nni_stream_dialer_set(d->dialer, name, buf, sz, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_setopt(wstran_ep_opts, name, d, buf, sz, t);
	}
	return (rv);
}